

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O2

void __thiscall Assimp::ValidateDSProcess::Validate(ValidateDSProcess *this,aiString *pString)

{
  uint uVar1;
  long lVar2;
  char *msg;
  
  uVar1 = pString->length;
  if (0x400 < (ulong)uVar1) {
    ReportError(this,"aiString::length is too large (%u, maximum is %lu)",(ulong)uVar1,0x400);
  }
  lVar2 = 0;
  do {
    if (pString->data[lVar2] == '\0') {
      if (uVar1 == (uint)lVar2) {
        return;
      }
      msg = "aiString::data is invalid: the terminal zero is at a wrong offset";
LAB_00130bdd:
      ReportError(this,msg);
    }
    if (lVar2 == 0x400) {
      msg = "aiString::data is invalid. There is no terminal character";
      goto LAB_00130bdd;
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

void ValidateDSProcess::Validate( const aiString* pString)
{
    if (pString->length > MAXLEN)
    {
        ReportError("aiString::length is too large (%u, maximum is %lu)",
            pString->length,MAXLEN);
    }
    const char* sz = pString->data;
    while (true)
    {
        if ('\0' == *sz)
        {
            if (pString->length != (unsigned int)(sz-pString->data)) {
                ReportError("aiString::data is invalid: the terminal zero is at a wrong offset");
            }
            break;
        }
        else if (sz >= &pString->data[MAXLEN]) {
            ReportError("aiString::data is invalid. There is no terminal character");
        }
        ++sz;
    }
}